

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

void nn_append_string(nn_parse_context *ctx,nn_option *opt,char *str)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  size_t sVar4;
  ushort **ppuVar5;
  ulong uVar6;
  long lVar7;
  unsigned_long *puVar8;
  
  pvVar2 = ctx->target;
  if (pvVar2 == (void *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","lst",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tools/options.c",
            0x151);
    fflush(_stderr);
    nn_err_abort();
  }
  lVar7 = (long)opt->offset;
  if (*(void **)((long)pvVar2 + lVar7) == (void *)0x0) {
    pvVar3 = malloc(8);
    *(undefined4 *)((long)pvVar2 + lVar7 + 0x10) = 1;
  }
  else {
    iVar1 = *(int *)((long)pvVar2 + lVar7 + 0x10);
    *(int *)((long)pvVar2 + lVar7 + 0x10) = iVar1 + 1;
    opt = (nn_option *)((long)iVar1 * 8 + 8);
    pvVar3 = realloc(*(void **)((long)pvVar2 + lVar7),(size_t)opt);
  }
  *(void **)((long)pvVar2 + lVar7) = pvVar3;
  if (pvVar3 == (void *)0x0) {
    nn_memory_error(ctx);
    sVar4 = strlen((char *)opt);
    if (0x37 < sVar4) {
      ppuVar5 = __ctype_b_loc();
      puVar8 = (unsigned_long *)((long)&opt->requires_mask + 1);
      for (uVar6 = 0x38; 1 < uVar6; uVar6 = uVar6 - 1) {
        if ((*(byte *)((long)*ppuVar5 + (long)*(char *)((long)puVar8 + -1) * 2 + 1) & 0x20) != 0) {
          fprintf((FILE *)ctx,"%.*s",uVar6,opt);
          return;
        }
        puVar8 = (unsigned_long *)((long)puVar8 + -1);
      }
    }
    fputs((char *)opt,(FILE *)ctx);
    return;
  }
  *(char **)((long)pvVar3 + (long)*(int *)((long)pvVar2 + lVar7 + 0x10) * 8 + -8) = str;
  return;
}

Assistant:

static void nn_append_string (struct nn_parse_context *ctx,
                             struct nn_option *opt, char *str)
{
    struct nn_string_list *lst;

    lst = (struct nn_string_list *)(((char *)ctx->target) + opt->offset);
    nn_assert (lst);
    if (lst->items) {
        lst->num += 1;
        lst->items = realloc (lst->items, sizeof (char *) * lst->num);
    } else {
        lst->items = malloc (sizeof (char *));
        lst->num = 1;
    }
    if (!lst->items) {
        nn_memory_error (ctx);
    }

    nn_assert (lst && lst->items);
    lst->items [lst->num - 1] = str;
}